

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O3

bool Fossilize::add_application_filters
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
                *output,Value *filters)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this;
  ushort uVar1;
  pointer pVVar2;
  pointer pVVar3;
  char *pcVar4;
  pointer pEVar5;
  Value *this_00;
  bool bVar6;
  ConstMemberIterator CVar7;
  Number NVar8;
  Type pGVar9;
  Ch *pCVar10;
  Type pGVar11;
  mapped_type *pmVar12;
  uint default_value;
  uint default_value_00;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  undefined8 extraout_RDX_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  Pointer pVVar14;
  AppInfo info;
  allocator local_129;
  Data local_128;
  undefined1 local_118;
  undefined7 uStack_117;
  _Alloc_hider local_108;
  char *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  char *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8;
  uint local_c0;
  uint uStack_bc;
  uint local_b8;
  undefined1 local_b4;
  vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> local_b0;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> vStack_98;
  vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> local_80;
  Data local_68;
  pointer local_58;
  Value *local_48;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  Pointer local_38;
  
  local_40 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)output;
  if ((filters->data_).f.flags == 3) {
    pVVar14 = (Pointer)((ulong)(filters->data_).s.str & 0xffffffffffff);
    CVar7 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(filters);
    uVar13 = extraout_RDX;
    local_48 = filters;
    if (CVar7.ptr_ != pVVar14) {
      do {
        if ((pVVar14->value).data_.f.flags != 3) {
          add_application_filters();
          goto LAB_0013d6f0;
        }
        this = &pVVar14->value;
        local_c0 = 0x400000;
        uStack_bc = 0;
        local_b8 = 0;
        local_b4 = 1;
        local_80.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_98.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_98.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_98.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c0 = default_get_member_uint(this,"minimumApiVersion",(uint)uVar13);
        local_b8 = default_get_member_uint(this,"minimumEngineVersion",default_value);
        uStack_bc = default_get_member_uint(this,"minimumApplicationVersion",default_value_00);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_128.s,(Ch *)this);
        uVar13 = local_128.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this);
        if (uVar13 == NVar8.i64) {
          local_b4 = true;
        }
        else {
          uVar1 = *(ushort *)(uVar13 + 0x1e);
          local_b4 = uVar1 == 10 || (uVar1 & 8) == 0;
        }
        local_38 = pVVar14;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_128.s,(Ch *)this);
        uVar13 = local_128.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this);
        if (uVar13 != NVar8.i64) {
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this,"blacklistedEnvironments");
          pEVar5 = local_b0.
                   super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((pGVar9->data_).f.flags == 3) {
            if (local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::_Destroy_aux<false>::__destroy<Fossilize::EnvInfo*>
                        (local_b0.
                         super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_b0.
                         super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish = pEVar5;
              if ((pGVar9->data_).f.flags != 3) {
                __assert_fail("IsObject()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                              ,0x4d8,
                              "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                             );
              }
            }
            pVVar14 = (Pointer)((ulong)(pGVar9->data_).s.str & 0xffffffffffff);
            CVar7 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd(pGVar9);
            if (CVar7.ptr_ != pVVar14) {
              this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)&pVVar14->value;
              do {
                if (*(short *)(this_01 + 0xe) != 3) {
                  add_application_filters();
                  goto LAB_0013d6a9;
                }
                local_128.n = (Number)&local_118;
                local_128.s.str = (char *)0x0;
                local_118 = 0;
                local_108._M_p = (pointer)&local_f8;
                local_100 = (char *)0x0;
                local_f8._M_local_buf[0] = '\0';
                local_e8._M_p = (pointer)&local_d8;
                local_e0 = (char *)0x0;
                local_d8._M_local_buf[0] = '\0';
                local_c8 = 0;
                pCVar10 = rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                       *)(this_01 + -0x10));
                uVar13 = local_128.s.str;
                strlen(pCVar10);
                std::__cxx11::string::_M_replace((ulong)&local_128,0,(char *)uVar13,(ulong)pCVar10);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_68.s,(Ch *)this_01);
                uVar13 = local_68.n;
                NVar8.i = (I)rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          *)this_01);
                if ((uVar13 != NVar8.i64) &&
                   (pGVar11 = rapidjson::
                              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ::operator[]<char_const>(this_01,"contains"),
                   (undefined1  [16])
                   ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x400000000000000) !=
                   (undefined1  [16])0x0)) {
                  pGVar11 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ::operator[]<char_const>(this_01,"contains");
                  pCVar10 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::GetString(pGVar11);
                  pcVar4 = local_100;
                  strlen(pCVar10);
                  std::__cxx11::string::_M_replace((ulong)&local_108,0,pcVar4,(ulong)pCVar10);
                }
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_68.s,(Ch *)this_01);
                uVar13 = local_68.n;
                NVar8.i = (I)rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          *)this_01);
                if ((uVar13 != NVar8.i64) &&
                   (pGVar11 = rapidjson::
                              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ::operator[]<char_const>(this_01,"equals"),
                   (undefined1  [16])
                   ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x400000000000000) !=
                   (undefined1  [16])0x0)) {
                  pGVar11 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ::operator[]<char_const>(this_01,"equals");
                  pCVar10 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::GetString(pGVar11);
                  pcVar4 = local_e0;
                  strlen(pCVar10);
                  std::__cxx11::string::_M_replace((ulong)&local_e8,0,pcVar4,(ulong)pCVar10);
                }
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_68.s,(Ch *)this_01);
                uVar13 = local_68.n;
                NVar8.i = (I)rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          *)this_01);
                if ((uVar13 != NVar8.i64) &&
                   (pGVar11 = rapidjson::
                              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ::operator[]<char_const>(this_01,"nonnull"),
                   (undefined1  [16])
                   ((undefined1  [16])pGVar11->data_ & (undefined1  [16])0x8000000000000) !=
                   (undefined1  [16])0x0)) {
                  pGVar11 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ::operator[]<char_const>(this_01,"nonnull");
                  uVar1 = (pGVar11->data_).f.flags;
                  if ((uVar1 & 8) == 0) {
                    __assert_fail("IsBool()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                                  ,0x48b,
                                  "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                                 );
                  }
                  local_c8 = uVar1 == 10;
                }
                std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::
                emplace_back<Fossilize::EnvInfo>(&local_b0,(EnvInfo *)&local_128.s);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_p != &local_d8) {
                  operator_delete(local_e8._M_p,
                                  CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                           local_d8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_p != &local_f8) {
                  operator_delete(local_108._M_p,
                                  CONCAT71(local_f8._M_allocated_capacity._1_7_,
                                           local_f8._M_local_buf[0]) + 1);
                }
                if (local_128.n.i64 != (Number)&local_118) {
                  operator_delete((void *)local_128.n,CONCAT71(uStack_117,local_118) + 1);
                }
                CVar7 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::MemberEnd(pGVar9);
                pVVar14 = (Pointer)(this_01 + 0x10);
                this_01 = this_01 + 0x20;
              } while (pVVar14 != CVar7.ptr_);
            }
            goto LAB_0013d45a;
          }
          add_application_filters();
LAB_0013d6a9:
          if (local_80.
              super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.
                            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (vStack_98.
              super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(vStack_98.
                            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)vStack_98.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)vStack_98.
                                  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::~vector(&local_b0);
          goto LAB_0013d6f0;
        }
LAB_0013d45a:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_128.s,(Ch *)this);
        uVar13 = local_128.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this);
        if (uVar13 != NVar8.i64) {
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this,"bucketVariantDependencies");
          bVar6 = parse_bucket_variant_dependencies(pGVar9,&vStack_98);
          if (!bVar6) goto LAB_0013d6a9;
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_128.s,(Ch *)this);
        uVar13 = local_128.n;
        NVar8.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(this);
        if (uVar13 != NVar8.i64) {
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this,"bucketVariantFeatureDependencies");
          bVar6 = parse_bucket_variant_dependencies(pGVar9,&local_80);
          if (!bVar6) goto LAB_0013d6a9;
        }
        pVVar14 = local_38;
        pCVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetString(&local_38->name);
        std::__cxx11::string::string((string *)&local_128.s,pCVar10,&local_129);
        pmVar12 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_40,(key_type *)&local_128.s);
        *(ulong *)((long)&pmVar12->minimum_application_version + 1) =
             CONCAT17(local_b4,CONCAT43(local_b8,uStack_bc._1_3_));
        pmVar12->minimum_api_version = local_c0;
        pmVar12->minimum_application_version = uStack_bc;
        local_58 = (pmVar12->env_infos).
                   super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.n = (Number)(pmVar12->env_infos).
                             super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start;
        local_68.s.str =
             (Ch *)(pmVar12->env_infos).
                   super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        (pmVar12->env_infos).
        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (pmVar12->env_infos).
        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (pmVar12->env_infos).
        super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.super__Vector_base<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::~vector
                  ((vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_> *)&local_68.s);
        pVVar2 = (pmVar12->variant_dependencies).
                 super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3 = (pmVar12->variant_dependencies).
                 super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar12->variant_dependencies).
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start =
             vStack_98.
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pmVar12->variant_dependencies).
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vStack_98.
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pmVar12->variant_dependencies).
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             vStack_98.
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        vStack_98.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_98.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_98.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pVVar2 != (pointer)0x0) {
          operator_delete(pVVar2,(long)pVVar3 - (long)pVVar2);
        }
        this_00 = local_48;
        pVVar2 = (pmVar12->variant_dependencies_feature).
                 super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3 = (pmVar12->variant_dependencies_feature).
                 super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar12->variant_dependencies_feature).
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_80.
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pmVar12->variant_dependencies_feature).
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_80.
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pmVar12->variant_dependencies_feature).
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_80.
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_80.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pVVar2 != (pointer)0x0) {
          operator_delete(pVVar2,(long)pVVar3 - (long)pVVar2);
        }
        if (local_128.n.i64 != (Number)&local_118) {
          operator_delete((void *)local_128.n,CONCAT71(uStack_117,local_118) + 1);
        }
        if (local_80.
            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.
                          super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (vStack_98.
            super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_98.
                          super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_98.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_98.
                                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<Fossilize::EnvInfo,_std::allocator<Fossilize::EnvInfo>_>::~vector(&local_b0);
        pVVar14 = pVVar14 + 1;
        CVar7 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd(this_00);
        uVar13 = extraout_RDX_00;
      } while (pVVar14 != CVar7.ptr_);
    }
    bVar6 = true;
  }
  else {
    add_application_filters();
LAB_0013d6f0:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool add_application_filters(std::unordered_map<std::string, AppInfo> &output, const Value *filters)
{
	if (!filters->IsObject())
	{
		LOGE("Not an object.\n");
		return false;
	}

	for (auto itr = filters->MemberBegin(); itr != filters->MemberEnd(); ++itr)
	{
		if (!itr->value.IsObject())
		{
			LOGE("Not an object.\n");
			return false;
		}

		AppInfo info;

		auto &value = itr->value;
		info.minimum_api_version = default_get_member_uint(value, "minimumApiVersion");
		info.minimum_engine_version = default_get_member_uint(value, "minimumEngineVersion");
		info.minimum_application_version = default_get_member_uint(value, "minimumApplicationVersion");
		info.record_immutable_samplers = default_get_member_bool(value, "recordImmutableSamplers", true);
		if (value.HasMember("blacklistedEnvironments"))
			if (!parse_blacklist_environments(value["blacklistedEnvironments"], info.env_infos))
				return false;
		if (value.HasMember("bucketVariantDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantDependencies"], info.variant_dependencies))
				return false;
		if (value.HasMember("bucketVariantFeatureDependencies"))
			if (!parse_bucket_variant_dependencies(value["bucketVariantFeatureDependencies"], info.variant_dependencies_feature))
				return false;
		output[itr->name.GetString()] = std::move(info);
	}

	return true;
}